

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFGsContainer.cpp
# Opt level: O0

void __thiscall CFGsContainer::compressAll(CFGsContainer *this)

{
  bool bVar1;
  pointer ppVar2;
  CFG *cfg;
  iterator ed;
  iterator it;
  CFGsContainer *this_local;
  
  ed = std::
       map<unsigned_long,_CFG_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CFG_*>_>_>
       ::begin(&this->m_cfgsMap);
  cfg = (CFG *)std::
               map<unsigned_long,_CFG_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CFG_*>_>_>
               ::end(&this->m_cfgsMap);
  while( true ) {
    bVar1 = std::operator!=(&ed,(_Self *)&cfg);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_CFG_*>_>::operator->(&ed);
    CFG::compress(ppVar2->second);
    std::_Rb_tree_iterator<std::pair<const_unsigned_long,_CFG_*>_>::operator++(&ed,0);
  }
  return;
}

Assistant:

void CFGsContainer::compressAll() {
	for (std::map<Addr, CFG*>::iterator it = m_cfgsMap.begin(),
			ed = m_cfgsMap.end(); it != ed; it++) {
		CFG* cfg = it->second;
		cfg->compress();
	}
}